

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropResizeLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  mapped_type *pmVar5;
  bool local_361;
  undefined1 local_2c0 [40];
  undefined1 local_298 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  CropResizeLayerParams *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [8];
  string err;
  _Self local_160;
  _Self local_158;
  allocator local_149;
  undefined1 local_148 [32];
  Result local_128;
  undefined1 local_f8 [32];
  Result local_d8;
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,2,2);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar2 = Result::good((Result *)(local_70 + 0x28));
  if (bVar2) {
    validateOutputCount((Result_conflict *)&local_a8,(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),&local_a8);
    Result::~Result(&local_a8);
  }
  bVar2 = Result::good((Result *)(local_70 + 0x28));
  uVar1 = r._32_8_;
  if (!bVar2) {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_d8.m_message._M_storage._M_storage[4] = '\x01';
    local_d8.m_message._M_storage._M_storage[5] = '\0';
    local_d8.m_message._M_storage._M_storage[6] = '\0';
    local_d8.m_message._M_storage._M_storage[7] = '\0';
    goto LAB_004111ac;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_f8,"CropResize",
               (allocator *)((long)local_128.m_message._M_storage._M_storage + 7));
    validateInputOutputRankEquality
              ((Result_conflict *)(local_f8 + 0x20),(NeuralNetworkLayer *)uVar1,(string *)local_f8,
               &this->blobNameToRank);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_f8 + 0x20));
    Result::~Result((Result *)(local_f8 + 0x20));
    std::__cxx11::string::~string((string *)local_f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)local_128.m_message._M_storage._M_storage + 7));
    bVar2 = Result::good((Result *)(local_70 + 0x28));
    uVar1 = r._32_8_;
    if (!bVar2) {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_d8.m_message._M_storage._M_storage[4] = '\x01';
      local_d8.m_message._M_storage._M_storage[5] = '\0';
      local_d8.m_message._M_storage._M_storage[6] = '\0';
      local_d8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_004111ac;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_148,"CropResize",&local_149);
    validateRankCount((Result_conflict *)(local_148 + 0x20),(NeuralNetworkLayer *)uVar1,
                      (string *)local_148,5,-1,&this->blobNameToRank);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_148 + 0x20));
    Result::~Result((Result *)(local_148 + 0x20));
    std::__cxx11::string::~string((string *)local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    bVar2 = Result::good((Result *)(local_70 + 0x28));
    if (!bVar2) {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_d8.m_message._M_storage._M_storage[4] = '\x01';
      local_d8.m_message._M_storage._M_storage[5] = '\0';
      local_d8.m_message._M_storage._M_storage[6] = '\0';
      local_d8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_004111ac;
    }
    psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_((NeuralNetworkLayer *)r._32_8_,0);
    local_158._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(&this->blobNameToRank,(key_type *)psVar4);
    local_160._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&this->blobNameToRank);
    bVar2 = std::operator!=(&local_158,&local_160);
    local_361 = false;
    if (bVar2) {
      psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_((NeuralNetworkLayer *)r._32_8_,1)
      ;
      err._M_storage._M_storage =
           (uchar  [8])
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&this->blobNameToRank,(key_type *)psVar4);
      err.super__Rb_tree_node_base._M_right =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(&this->blobNameToRank);
      local_361 = std::operator!=((_Self *)&err._M_storage,
                                  (_Self *)&err.super__Rb_tree_node_base._M_right);
    }
    if (local_361 != false) {
      psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_((NeuralNetworkLayer *)r._32_8_,0)
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(&this->blobNameToRank,psVar4);
      iVar3 = *pmVar5;
      psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_((NeuralNetworkLayer *)r._32_8_,1)
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(&this->blobNameToRank,psVar4);
      if (iVar3 != *pmVar5) {
        std::__cxx11::string::string((string *)local_190);
        psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
        std::__cxx11::string::string((string *)&params,(string *)psVar4);
        std::operator+(&local_1d0,"Layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params)
        ;
        std::operator+(&local_1b0,&local_1d0,
                       "\' of type \'CropResize\' expects equal ranks for its inputs, but they are not equal."
                      );
        std::__cxx11::string::operator=((string *)local_190,(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&params);
        Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_190
                      );
        local_d8.m_message._M_storage._M_storage[4] = '\x01';
        local_d8.m_message._M_storage._M_storage[5] = '\0';
        local_d8.m_message._M_storage._M_storage[6] = '\0';
        local_d8.m_message._M_storage._M_storage[7] = '\0';
        std::__cxx11::string::~string((string *)local_190);
        goto LAB_004111ac;
      }
    }
  }
  local_218._M_storage._M_storage =
       (uchar  [8])Specification::NeuralNetworkLayer::cropresize((NeuralNetworkLayer *)r._32_8_);
  iVar3 = Specification::CropResizeLayerParams::targetsize_size
                    ((CropResizeLayerParams *)local_218._M_storage._M_storage);
  if ((iVar3 == 0) ||
     (iVar3 = Specification::CropResizeLayerParams::targetsize_size
                        ((CropResizeLayerParams *)local_218._M_storage._M_storage), iVar3 == 2)) {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_d8.m_message._M_storage._M_storage[4] = '\x01';
    local_d8.m_message._M_storage._M_storage[5] = '\0';
    local_d8.m_message._M_storage._M_storage[6] = '\0';
    local_d8.m_message._M_storage._M_storage[7] = '\0';
  }
  else {
    psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_298 + 0x20),"Target Size in the crop resize layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4);
    std::operator+(&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_298 + 0x20),
                   "\' must be a vector of size 2 (i.e height, width) but is a vector of size ");
    iVar3 = Specification::CropResizeLayerParams::targetsize_size
                      ((CropResizeLayerParams *)local_218._M_storage._M_storage);
    std::__cxx11::to_string((string *)local_298,iVar3);
    std::operator+(&local_238,&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   &local_238,".");
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)(local_298 + 0x20));
    Result::Result((Result *)local_2c0,INVALID_MODEL_PARAMETERS,&local_218);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)local_2c0);
    Result::~Result((Result *)local_2c0);
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_d8.m_message._M_storage._M_storage[4] = '\x01';
    local_d8.m_message._M_storage._M_storage[5] = '\0';
    local_d8.m_message._M_storage._M_storage[6] = '\0';
    local_d8.m_message._M_storage._M_storage[7] = '\0';
    std::__cxx11::string::~string((string *)&local_218);
  }
LAB_004111ac:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropResizeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "CropResize", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "CropResize", 5, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
            blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
            if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                std::string err;
                err = "Layer '" + std::string(layer.name()) + "' of type 'CropResize' expects equal ranks for its inputs, but they are not equal.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }

    }

    const auto& params = layer.cropresize();
    // target Size must be 2D if provided
    if (!(params.targetsize_size() == 0 || params.targetsize_size() == 2)) {
        std::string err = "Target Size in the crop resize layer '" + layer.name() + "' must be a vector of size 2 (i.e height, width) but is a vector of size " + std::to_string(params.targetsize_size()) + ".";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}